

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall fasttext::SoftmaxLoss::computeOutput(SoftmaxLoss *this,State *state)

{
  pointer pfVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  pointer pfVar14;
  ulong uVar15;
  uint uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  double dVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  float local_38;
  
  Vector::mul(&state->output,
              (((this->super_Loss).wo_)->
              super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
              &state->hidden);
  pfVar14 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)(state->output).data_.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pfVar14) >> 2);
  if (0 < (int)uVar16) {
    auVar22 = ZEXT464((uint)*pfVar14);
    uVar15 = 0;
    do {
      auVar7 = vmaxss_avx(auVar22._0_16_,ZEXT416((uint)pfVar14[uVar15]));
      auVar22 = ZEXT1664(auVar7);
      uVar15 = uVar15 + 1;
    } while ((uVar16 & 0x7fffffff) != uVar15);
    if (0 < (int)uVar16) {
      auVar23 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar15 = 0;
      do {
        dVar20 = exp((double)(pfVar14[uVar15] - auVar22._0_4_));
        local_38 = auVar23._0_4_;
        auVar22 = ZEXT464((uint)auVar22._0_4_);
        pfVar14 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar14[uVar15] = (float)dVar20;
        local_38 = local_38 + (float)dVar20;
        auVar23 = ZEXT464((uint)local_38);
        uVar15 = uVar15 + 1;
      } while ((uVar16 & 0x7fffffff) != uVar15);
      if (0 < (int)uVar16) {
        auVar17 = vpbroadcastq_avx512vl();
        auVar21._4_4_ = local_38;
        auVar21._0_4_ = local_38;
        auVar21._8_4_ = local_38;
        auVar21._12_4_ = local_38;
        auVar21._16_4_ = local_38;
        auVar21._20_4_ = local_38;
        auVar21._24_4_ = local_38;
        auVar21._28_4_ = local_38;
        uVar15 = 0;
        auVar8 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar9 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        do {
          auVar18 = vpbroadcastq_avx512vl();
          auVar19 = vpor_avx2(auVar18,auVar8);
          auVar18 = vpor_avx2(auVar18,auVar9);
          uVar10 = vpcmpuq_avx512vl(auVar18,auVar17,2);
          bVar13 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512vl(auVar19,auVar17,2);
          bVar12 = (byte)uVar10;
          bVar11 = bVar12 << 4;
          pfVar1 = pfVar14 + uVar15;
          auVar19._4_4_ = (uint)((bVar13 & 2) >> 1) * (int)pfVar1[1];
          auVar19._0_4_ = (uint)(bVar13 & 1) * (int)*pfVar1;
          auVar19._8_4_ = (uint)((bVar13 & 4) >> 2) * (int)pfVar1[2];
          auVar19._12_4_ = (uint)((bVar13 & 0xf) >> 3) * (int)pfVar1[3];
          auVar19._16_4_ = (uint)(bVar12 & 1) * (int)pfVar1[4];
          auVar19._20_4_ = (uint)(bVar11 >> 5 & 1) * (int)pfVar1[5];
          auVar19._24_4_ = (uint)(bVar11 >> 6 & 1) * (int)pfVar1[6];
          auVar19._28_4_ = (uint)(bVar11 >> 7) * (int)pfVar1[7];
          auVar19 = vdivps_avx(auVar19,auVar21);
          pfVar1 = pfVar14 + uVar15;
          bVar2 = (bool)((bVar13 & 2) >> 1);
          bVar3 = (bool)((bVar13 & 4) >> 2);
          bVar4 = (bool)((bVar13 & 0xf) >> 3);
          bVar5 = (bool)(bVar11 >> 5 & 1);
          bVar6 = (bool)(bVar11 >> 6 & 1);
          *pfVar1 = (float)((uint)(bVar13 & 1) * auVar19._0_4_ |
                           (uint)!(bool)(bVar13 & 1) * (int)*pfVar1);
          pfVar1[1] = (float)((uint)bVar2 * auVar19._4_4_ | (uint)!bVar2 * (int)pfVar1[1]);
          pfVar1[2] = (float)((uint)bVar3 * auVar19._8_4_ | (uint)!bVar3 * (int)pfVar1[2]);
          pfVar1[3] = (float)((uint)bVar4 * auVar19._12_4_ | (uint)!bVar4 * (int)pfVar1[3]);
          pfVar1[4] = (float)((uint)(bVar12 & 1) * auVar19._16_4_ |
                             (uint)!(bool)(bVar12 & 1) * (int)pfVar1[4]);
          pfVar1[5] = (float)((uint)bVar5 * auVar19._20_4_ | (uint)!bVar5 * (int)pfVar1[5]);
          pfVar1[6] = (float)((uint)bVar6 * auVar19._24_4_ | (uint)!bVar6 * (int)pfVar1[6]);
          pfVar1[7] = (float)((uint)(bVar11 >> 7) * auVar19._28_4_ |
                             (uint)!(bool)(bVar11 >> 7) * (int)pfVar1[7]);
          uVar15 = uVar15 + 8;
        } while ((uVar16 + 7 & 0xfffffff8) != uVar15);
      }
    }
  }
  return;
}

Assistant:

void SoftmaxLoss::computeOutput(Model::State& state) const {
  Vector& output = state.output;
  output.mul(*wo_, state.hidden);
  real max = output[0], z = 0.0;
  int32_t osz = output.size();
  for (int32_t i = 0; i < osz; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz; i++) {
    output[i] /= z;
  }
}